

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.c
# Opt level: O3

int main(int argc,char **argv)

{
  zt_hexdump_str("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ",0x34,(zt_hexdump_output)0x0,
                 (void *)0x0);
  zt_hexdump_str("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                 ,0x9c,(zt_hexdump_output)0x0,(void *)0x0);
  return 0;
}

Assistant:

int
main(int argc UNUSED, char * argv[] UNUSED) {
    char    * ALPHA = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    char    * ALPHA2 = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";

    zt_hexdump_str(ALPHA, strlen(ALPHA), NULL, NULL);
    zt_hexdump_str(ALPHA2, strlen(ALPHA2), NULL, NULL);

#if 0
    {
        FILE    * fp;
        if ((fp = fopen(argv[0], "r")) != NULL) {
            zt_hexdump((int (*)(void*))fgetc, fp, NULL, NULL);
            fclose(fp);
        }
    }
#endif

    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 16), printf("%s\n", f), free(f); */
    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 32), printf("%s\n", f), free(f); */
    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 50), printf("%s\n", f), free(f); */
    /* f = zt_hex_dump(ALPHA, strlen(ALPHA), 64), printf("%s\n", f), free(f); */

    return 0;
}